

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void variance_double_2_suite::test_clear(void)

{
  size_type local_78;
  undefined4 local_6c;
  basic_moment<double,_2UL,_(trial::online::with)2> local_68;
  
  local_68.super_basic_moment<double,_2UL,_(trial::online::with)1>.member.window.
  super_array<double,_2UL>._M_elems[0] = 0.0;
  local_68.super_basic_moment<double,_2UL,_(trial::online::with)1>.member.window.
  super_array<double,_2UL>._M_elems[1] = 0.0;
  local_68.super_basic_moment<double,_2UL,_(trial::online::with)1>.member.window.
  super_span<double,_2UL>.member.size = 0;
  local_68.super_basic_moment<double,_2UL,_(trial::online::with)1>.member.window.
  super_span<double,_2UL>.member.next = 2;
  local_68.super_basic_moment<double,_2UL,_(trial::online::with)1>.member.mean = 0.0;
  local_68.sum.variance = 0.0;
  local_68.super_basic_moment<double,_2UL,_(trial::online::with)1>.member.window.
  super_span<double,_2UL>.member.data = (pointer)&local_68;
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)2>::push(&local_68,1.0);
  local_78 = local_68.super_basic_moment<double,_2UL,_(trial::online::with)1>.member.window.
             super_span<double,_2UL>.member.size;
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x263,"void variance_double_2_suite::test_clear()",&local_78,&local_6c);
  local_68.super_basic_moment<double,_2UL,_(trial::online::with)1>.member.window.
  super_span<double,_2UL>.member.size = 0;
  local_68.super_basic_moment<double,_2UL,_(trial::online::with)1>.member.window.
  super_span<double,_2UL>.member.next = 2;
  local_68.super_basic_moment<double,_2UL,_(trial::online::with)1>.member.mean = 0.0;
  local_68.sum.variance = 0.0;
  local_78 = 0;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x265,"void variance_double_2_suite::test_clear()",&local_78,&local_6c);
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)2>::push(&local_68,2.0);
  local_78 = local_68.super_basic_moment<double,_2UL,_(trial::online::with)1>.member.window.
             super_span<double,_2UL>.member.size;
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x267,"void variance_double_2_suite::test_clear()",&local_78,&local_6c);
  return;
}

Assistant:

void test_same()
{
    window::moment<double, 2> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
}